

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int secp256r1_create_key_exchange(ptls_key_exchange_context_t **ctx,ptls_iovec_t *pubkey)

{
  int iVar1;
  ptls_iovec_t *pubkey_local;
  ptls_key_exchange_context_t **ctx_local;
  
  iVar1 = x9_62_create_key_exchange(ctx,pubkey,0x19f);
  return iVar1;
}

Assistant:

static int secp256r1_create_key_exchange(ptls_key_exchange_context_t **ctx, ptls_iovec_t *pubkey)
{
    return x9_62_create_key_exchange(ctx, pubkey, NID_X9_62_prime256v1);
}